

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O2

void __thiscall Bracket::Bracket(Bracket *this)

{
  (this->super_Atom)._vptr_Atom = (_func_int **)&PTR__Bracket_00108c40;
  (this->func)._M_dataplus._M_p = (pointer)&(this->func).field_2;
  (this->func)._M_string_length = 0;
  (this->func).field_2._M_local_buf[0] = '\0';
  (this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->para;
  (this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->para;
  (this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl._M_node._M_size = 0;
  return;
}

Assistant:

Bracket::Bracket() {}